

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

void wwRepW(word *a,size_t n,word w)

{
  word w_local;
  size_t n_local;
  word *a_local;
  
  n_local = n;
  if (n != 0) {
    while (n_local != 0) {
      a[n_local - 1] = w;
      n_local = n_local - 1;
    }
  }
  return;
}

Assistant:

void wwRepW(word a[], size_t n, register word w)
{
	ASSERT(wwIsValid(a, n));
	if (n)
		for (; n--; a[n] = w);
	else
		ASSERT(w == 0);
	w = 0;
}